

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O1

MPP_RET cluster_worker_init(ClusterWorker *p,MppCluster *cluster)

{
  int iVar1;
  MppThread *this;
  
  (p->list_task).next = &p->list_task;
  (p->list_task).prev = &p->list_task;
  iVar1 = cluster->worker_id;
  cluster->worker_id = iVar1 + 1;
  p->worker_id = iVar1;
  p->work_count = 0;
  p->cluster = cluster;
  p->state = WORKER_IDLE;
  p->batch_count = 1;
  snprintf(p->name,0x1f,"%d:W%d",(ulong)(uint)cluster->pid);
  this = (MppThread *)operator_new(0x198);
  MppThread::MppThread(this,cluster->worker_func,p,p->name);
  p->thd = this;
  MppThread::start(this);
  return MPP_OK;
}

Assistant:

MPP_RET cluster_worker_init(ClusterWorker *p, MppCluster *cluster)
{
    MppThread *thd = NULL;
    MPP_RET ret = MPP_NOK;

    INIT_LIST_HEAD(&p->list_task);
    p->worker_id = cluster->worker_id++;

    p->batch_count = 1;
    p->work_count = 0;
    p->cluster = cluster;
    p->state = WORKER_IDLE;
    snprintf(p->name, sizeof(p->name) - 1, "%d:W%d", cluster->pid, p->worker_id);
    thd = new MppThread(cluster->worker_func, p, p->name);
    if (thd) {
        p->thd = thd;
        thd->start();
        ret = MPP_OK;
    }

    return ret;
}